

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Generators::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  GeneratorUntypedBase *pGVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var4;
  
  uVar2 = TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  _Var4._M_current = (shared_ptr<Catch::TestCaseTracking::ITracker> *)(ulong)uVar2;
  if (((this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (_Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,__gnu_cxx::__ops::_Iter_pred<Catch::Generators::GeneratorTracker::close()::_lambda(std::shared_ptr<Catch::TestCaseTracking::ITracker>)_1_>>
                        (),
     _Var4._M_current !=
     (this->super_TrackerBase).super_ITracker.m_children.
     super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->super_TrackerBase).m_runState != CompletedSuccessfully) {
      return (int)_Var4._M_current;
    }
    pGVar1 = (this->m_generator).m_ptr;
    if (pGVar1 == (GeneratorUntypedBase *)0x0) {
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                    ,0x4b8,
                    "T *Catch::Detail::unique_ptr<Catch::Generators::GeneratorUntypedBase>::operator->() const [T = Catch::Generators::GeneratorUntypedBase]"
                   );
    }
    iVar3 = (*pGVar1->_vptr_GeneratorUntypedBase[2])();
    if ((char)iVar3 == '\0') {
      return iVar3;
    }
  }
  std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).super_ITracker.m_children);
  (this->super_TrackerBase).m_runState = Executing;
  return extraout_EAX;
}

Assistant:

void close() override {
                TrackerBase::close();
                // If a generator has a child (it is followed by a section)
                // and none of its children have started, then we must wait
                // until later to start consuming its values.
                // This catches cases where `GENERATE` is placed between two
                // `SECTION`s.
                // **The check for m_children.empty cannot be removed**.
                // doing so would break `GENERATE` _not_ followed by `SECTION`s.
                const bool should_wait_for_child =
                    !m_children.empty() &&
                    std::find_if(m_children.begin(),
                        m_children.end(),
                        [](TestCaseTracking::ITrackerPtr tracker) {
                            return tracker->hasStarted();
                        }) == m_children.end();

                        // This check is a bit tricky, because m_generator->next()
                        // has a side-effect, where it consumes generator's current
                        // value, but we do not want to invoke the side-effect if
                        // this generator is still waiting for any child to start.
                        if (should_wait_for_child ||
                            (m_runState == CompletedSuccessfully &&
                                m_generator->next())) {
                            m_children.clear();
                            m_runState = Executing;
                        }
            }